

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

Emb_Obj_t * Emb_ManPerformBfs(Emb_Man_t *p,Vec_Int_t *vThis,Vec_Int_t *vNext,Emb_Dat_t *pDist)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  Emb_Obj_t *pEVar4;
  bool bVar5;
  float fVar6;
  int local_50;
  int local_4c;
  int k;
  int i;
  Emb_Obj_t *pResult;
  Emb_Obj_t *pNext;
  Emb_Obj_t *pThis;
  Vec_Int_t *vTemp;
  Emb_Dat_t *pDist_local;
  Vec_Int_t *vNext_local;
  Vec_Int_t *vThis_local;
  Emb_Man_t *p_local;
  
  iVar2 = Vec_IntSize(vThis);
  if (iVar2 < 1) {
    __assert_fail("Vec_IntSize(vThis) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3a7,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  p->nDistMax = 0;
  pDist_local = (Emb_Dat_t *)vNext;
  vNext_local = vThis;
  while (pVVar1 = vNext_local, iVar2 = Vec_IntSize(vNext_local), 0 < iVar2) {
    iVar2 = Vec_IntSize(vNext_local);
    p->nReached = iVar2 + p->nReached;
    Vec_IntClear((Vec_Int_t *)pDist_local);
    local_4c = 0;
    while( true ) {
      iVar2 = Vec_IntSize(vNext_local);
      bVar5 = false;
      if (local_4c < iVar2) {
        uVar3 = Vec_IntEntry(vNext_local,local_4c);
        pNext = Emb_ManObj(p,uVar3);
        bVar5 = pNext != (Emb_Obj_t *)0x0;
      }
      if (!bVar5) break;
      if (pDist != (Emb_Dat_t *)0x0) {
        pDist[(pNext->field_8).Value] = (float)p->nDistMax;
      }
      local_50 = 0;
      while( true ) {
        bVar5 = false;
        if (local_50 < (int)(*(uint *)pNext >> 4)) {
          pResult = Emb_ObjFanin(pNext,local_50);
          bVar5 = pResult != (Emb_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar2 = Emb_ObjIsTravIdCurrent(p,pResult);
        if (iVar2 == 0) {
          Emb_ObjSetTravIdCurrent(p,pResult);
          Vec_IntPush((Vec_Int_t *)pDist_local,pResult->hHandle);
        }
        local_50 = local_50 + 1;
      }
      local_50 = 0;
      while( true ) {
        bVar5 = false;
        if (local_50 < (int)pNext->nFanouts) {
          pResult = Emb_ObjFanout(pNext,local_50);
          bVar5 = pResult != (Emb_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar2 = Emb_ObjIsTravIdCurrent(p,pResult);
        if (iVar2 == 0) {
          Emb_ObjSetTravIdCurrent(p,pResult);
          Vec_IntPush((Vec_Int_t *)pDist_local,pResult->hHandle);
        }
        local_50 = local_50 + 1;
      }
      local_4c = local_4c + 1;
    }
    vNext_local = (Vec_Int_t *)pDist_local;
    pDist_local = (Emb_Dat_t *)pVVar1;
    p->nDistMax = p->nDistMax + 1;
  }
  iVar2 = Vec_IntSize((Vec_Int_t *)pDist_local);
  if (iVar2 < 1) {
    __assert_fail("Vec_IntSize(vNext) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3c0,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  uVar3 = Vec_IntEntry((Vec_Int_t *)pDist_local,0);
  pEVar4 = Emb_ManObj(p,uVar3);
  if ((pDist != (Emb_Dat_t *)0x0) &&
     ((fVar6 = (float)(p->nDistMax + -1), pDist[(pEVar4->field_8).Value] != fVar6 ||
      (NAN(pDist[(pEVar4->field_8).Value]) || NAN(fVar6))))) {
    __assert_fail("pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3c2,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  return pEVar4;
}

Assistant:

Emb_Obj_t * Emb_ManPerformBfs( Emb_Man_t * p, Vec_Int_t * vThis, Vec_Int_t * vNext, Emb_Dat_t * pDist )
{
    Vec_Int_t * vTemp;
    Emb_Obj_t * pThis, * pNext, * pResult;
    int i, k;
    assert( Vec_IntSize(vThis) > 0 );
    for ( p->nDistMax = 0; Vec_IntSize(vThis) > 0; p->nDistMax++ )
    {
        p->nReached += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            if ( pDist ) pDist[pThis->Value] = p->nDistMax;
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    assert( Vec_IntSize(vNext) > 0 );
    pResult = Emb_ManObj( p, Vec_IntEntry(vNext, 0) );
    assert( pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1 );
    return pResult;
}